

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeRAW.cpp
# Opt level: O0

void __thiscall FormatTypeRAW::HandleOOB(FormatTypeRAW *this,uchar *buffer,int *pos)

{
  uchar uVar1;
  unsigned_short uVar2;
  uint uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  char *info_00;
  uint uVar7;
  char *info;
  uint result_code;
  uint stream_pos_1;
  IndexElement element;
  char buffer_1 [256];
  uint indexCounter;
  uint sampleCounter;
  uint streamPos;
  int dbg;
  uint transfert_time;
  uint stream_pos;
  unsigned_short size;
  char type;
  int *pos_local;
  uchar *buffer_local;
  FormatTypeRAW *this_local;
  
  uVar1 = GetFromBuffer(this,buffer,pos);
  uVar2 = GetWFromBuffer(this,buffer,pos);
  this->stream_position_ = this->stream_position_ - 3;
  switch(uVar1) {
  case '\0':
    break;
  case '\x01':
    GetDWFromBuffer(this,buffer,pos);
    GetDWFromBuffer(this,buffer,pos);
    this->stream_position_ = this->stream_position_ - 8;
    break;
  case '\x02':
    uVar4 = GetDWFromBuffer(this,buffer,pos);
    uVar3 = (uint)uVar4;
    uVar5 = GetDWFromBuffer(this,buffer,pos);
    uVar6 = GetDWFromBuffer(this,buffer,pos);
    uVar7 = (uint)uVar6;
    this->stream_position_ = this->stream_position_ - 0xc;
    if (this->last_stream_index_position_ == 0) {
      sprintf((char *)&element.stream_position,
              "Index %i found at pos : %i - Pos in file : %i - Sample counter : %i",
              uVar6 & 0xffffffff,uVar4 & 0xffffffff,(ulong)this->stream_position_,uVar5 & 0xffffffff
             );
    }
    else {
      sprintf((char *)&element.stream_position,
              "Index found at pos : %i - Diff with last : %i - Pos in file : %i - Diff with last : %i - Sample counter : %i"
              ,uVar6 & 0xffffffff,(ulong)(uVar7 - this->last_stream_index_count_),uVar4 & 0xffffffff
              ,(ulong)(uVar3 - this->last_stream_index_position_),(uint)uVar5);
    }
    this->last_stream_index_position_ = uVar3;
    this->last_stream_index_count_ = uVar7;
    result_code = (uint)uVar5;
    stream_pos_1 = uVar3;
    element.flux_value = uVar7;
    std::vector<FormatTypeRAW::IndexElement,_std::allocator<FormatTypeRAW::IndexElement>_>::
    push_back(&this->index_list_,(value_type *)&result_code);
    break;
  case '\x03':
    GetDWFromBuffer(this,buffer,pos);
    GetDWFromBuffer(this,buffer,pos);
    this->stream_position_ = this->stream_position_ - 8;
    break;
  case '\x04':
    info_00 = (char *)operator_new__((ulong)uVar2);
    ReadASCIIFromBuffer(this,buffer,pos,info_00,(uint)uVar2);
    HandleHWInfo(this,info_00,(uint)uVar2);
    if (info_00 != (char *)0x0) {
      operator_delete__(info_00);
    }
    break;
  default:
    break;
  case '\r':
    this->finished_ = true;
  }
  return;
}

Assistant:

void FormatTypeRAW::HandleOOB(const unsigned char* buffer, int& pos)
{
   char type;
   unsigned short size;

   type = GetFromBuffer(buffer, pos);
   size = GetWFromBuffer(buffer, pos);
   stream_position_ -= 3;

   switch (type)
   {
   case 0x00: // Invalid O_OB
      {
         //      LOG(_T("ERROR : INVALID O_OB !"));
         //      LOGEOL;
         //m_bFinished = true;
         break;
      }
   case 0x01:
      {
         // size should be 8
         // Use it for check ?
         unsigned int stream_pos = GetDWFromBuffer(buffer, pos);
         unsigned int transfert_time = GetDWFromBuffer(buffer, pos);
         stream_position_ -= 8;
         if (stream_position_ != stream_pos)
         {
            int dbg = 1;
         }
         break;
      }

   case 0x02: // Index signal data
      {
         // size should be 0x0C - TOCHECK ?
         unsigned int streamPos = GetDWFromBuffer(buffer, pos);
         unsigned int sampleCounter = GetDWFromBuffer(buffer, pos);
         unsigned int indexCounter = GetDWFromBuffer(buffer, pos);
         stream_position_ -= 12;
         char buffer[256];
         if (last_stream_index_position_ == 0)
         {
            sprintf(buffer, "Index %i found at pos : %i - Pos in file : %i - Sample counter : %i", indexCounter,
                    streamPos, stream_position_, sampleCounter);
         }
         else
         {
            sprintf(buffer,
                    "Index found at pos : %i - Diff with last : %i - Pos in file : %i - Diff with last : %i - Sample counter : %i",
                    indexCounter, indexCounter - last_stream_index_count_, streamPos,
                    streamPos - last_stream_index_position_, sampleCounter);
         }
         last_stream_index_position_ = streamPos;
         last_stream_index_count_ = indexCounter;
         /*LOG(buffer);
         LOGEOL;*/
         IndexElement element;

         element.flux_value = sampleCounter;
         element.index_clock = indexCounter;
         element.stream_position = streamPos;


         index_list_.push_back(element);

         break;
      }

   case 0x03: // No more flux to transfer (one per track)
      {
         // size should be 8 - TOCHECK ?
         unsigned int stream_pos = GetDWFromBuffer(buffer, pos);
         unsigned int result_code = GetDWFromBuffer(buffer, pos);
         stream_position_ -= 8;
         if (stream_position_ != stream_pos)
         {
            /*LOGEOL
            LOG(_T("Stream position error.... "));
            LOGEOL*/
         }
         break;
      }
   case 0x04: // HW Information from KryoFlux device
      {
         char* info = new char[size];

         ReadASCIIFromBuffer(buffer, pos, info, size);
         OutputDebugString(info);
         OutputDebugString("\n");
         // Handle it
         HandleHWInfo(info, size);
         delete[]info;

         break;
      }
   case 0xD: // End of file (no more data to process)
      finished_ = true;
      break;
   default:
      // ERROR !
      break;
   }
}